

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.h
# Opt level: O2

void ptls_aead__do_encrypt_v
               (ptls_aead_context_t *ctx,void *_output,ptls_iovec_t *input,size_t incnt,uint64_t seq
               ,void *aad,size_t aadlen)

{
  size_t sVar1;
  size_t *psVar2;
  bool bVar3;
  
  (*ctx->do_encrypt_init)(ctx,seq,aad,aadlen);
  psVar2 = &input->len;
  while (bVar3 = incnt != 0, incnt = incnt - 1, bVar3) {
    sVar1 = (*ctx->do_encrypt_update)(ctx,_output,((ptls_iovec_t *)(psVar2 + -1))->base,*psVar2);
    _output = (void *)((long)_output + sVar1);
    psVar2 = psVar2 + 2;
  }
  (*ctx->do_encrypt_final)(ctx,_output);
  return;
}

Assistant:

inline void ptls_aead__do_encrypt_v(ptls_aead_context_t *ctx, void *_output, ptls_iovec_t *input, size_t incnt, uint64_t seq,
                                    const void *aad, size_t aadlen)
{
    uint8_t *output = (uint8_t *)_output;

    ctx->do_encrypt_init(ctx, seq, aad, aadlen);
    for (size_t i = 0; i < incnt; ++i)
        output += ctx->do_encrypt_update(ctx, output, input[i].base, input[i].len);
    ctx->do_encrypt_final(ctx, output);
}